

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bconchar(bstring b,char c)

{
  uint uVar1;
  int iVar2;
  int d;
  char c_local;
  bstring b_local;
  
  if (((b != (bstring)0x0) && (uVar1 = b->slen, -1 < (int)(uVar1 | b->mlen - uVar1))) &&
     (iVar2 = balloc(b,uVar1 + 2), iVar2 == 0)) {
    b->data[(int)uVar1] = c;
    b->data[(int)(uVar1 + 1)] = '\0';
    b->slen = b->slen + 1;
    return 0;
  }
  return -1;
}

Assistant:

int bconchar (bstring b, char c) {
int d;

	if (b == NULL) return BSTR_ERR;
	d = b->slen;
	if ((d | (b->mlen - d)) < 0 || balloc (b, d + 2) != BSTR_OK) return BSTR_ERR;
	b->data[d] = (unsigned char) c;
	b->data[d + 1] = (unsigned char) '\0';
	b->slen++;
	return 0;
}